

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void cf_aes_init(cf_aes_context *ctx,uint8_t *key,size_t nkey)

{
  size_t nkey_local;
  uint8_t *key_local;
  cf_aes_context *ctx_local;
  
  ctx->ks[0x37] = 0;
  ctx->ks[0x38] = 0;
  ctx->ks[0x39] = 0;
  ctx->ks[0x3a] = 0;
  ctx->ks[0x33] = 0;
  ctx->ks[0x34] = 0;
  ctx->ks[0x35] = 0;
  ctx->ks[0x36] = 0;
  ctx->ks[0x2f] = 0;
  ctx->ks[0x30] = 0;
  ctx->ks[0x31] = 0;
  ctx->ks[0x32] = 0;
  ctx->ks[0x2b] = 0;
  ctx->ks[0x2c] = 0;
  ctx->ks[0x2d] = 0;
  ctx->ks[0x2e] = 0;
  ctx->ks[0x27] = 0;
  ctx->ks[0x28] = 0;
  ctx->ks[0x29] = 0;
  ctx->ks[0x2a] = 0;
  ctx->ks[0x23] = 0;
  ctx->ks[0x24] = 0;
  ctx->ks[0x25] = 0;
  ctx->ks[0x26] = 0;
  ctx->ks[0x1f] = 0;
  ctx->ks[0x20] = 0;
  ctx->ks[0x21] = 0;
  ctx->ks[0x22] = 0;
  ctx->ks[0x1b] = 0;
  ctx->ks[0x1c] = 0;
  ctx->ks[0x1d] = 0;
  ctx->ks[0x1e] = 0;
  ctx->ks[0x17] = 0;
  ctx->ks[0x18] = 0;
  ctx->ks[0x19] = 0;
  ctx->ks[0x1a] = 0;
  ctx->ks[0x13] = 0;
  ctx->ks[0x14] = 0;
  ctx->ks[0x15] = 0;
  ctx->ks[0x16] = 0;
  ctx->ks[0xf] = 0;
  ctx->ks[0x10] = 0;
  ctx->ks[0x11] = 0;
  ctx->ks[0x12] = 0;
  ctx->ks[0xb] = 0;
  ctx->ks[0xc] = 0;
  ctx->ks[0xd] = 0;
  ctx->ks[0xe] = 0;
  ctx->ks[7] = 0;
  ctx->ks[8] = 0;
  ctx->ks[9] = 0;
  ctx->ks[10] = 0;
  ctx->ks[3] = 0;
  ctx->ks[4] = 0;
  ctx->ks[5] = 0;
  ctx->ks[6] = 0;
  ctx->rounds = 0;
  ctx->ks[0] = 0;
  ctx->ks[1] = 0;
  ctx->ks[2] = 0;
  ctx->ks[0x3b] = 0;
  if (nkey == 0x10) {
    ctx->rounds = 10;
    aes_schedule(ctx,key,0x10);
  }
  else if (nkey == 0x18) {
    ctx->rounds = 0xc;
    aes_schedule(ctx,key,0x18);
  }
  else {
    if (nkey != 0x20) {
      abort();
    }
    ctx->rounds = 0xe;
    aes_schedule(ctx,key,0x20);
  }
  return;
}

Assistant:

void cf_aes_init(cf_aes_context *ctx, const uint8_t *key, size_t nkey)
{
  memset(ctx, 0, sizeof *ctx);

  switch (nkey)
  {
#if CF_AES_MAXROUNDS >= AES128_ROUNDS
    case 16:
      ctx->rounds = AES128_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

#if CF_AES_MAXROUNDS >= AES192_ROUNDS
    case 24:
      ctx->rounds = AES192_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

#if CF_AES_MAXROUNDS >= AES256_ROUNDS
    case 32:
      ctx->rounds = AES256_ROUNDS;
      aes_schedule(ctx, key, nkey);
      break;
#endif

    default:
      abort();
  }
}